

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

_Bool al_ustr_vappendf(ALLEGRO_USTR *us,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  int count;
  va_list arglist;
  __va_list_tag local_38;
  
  count = 0x80;
  do {
    local_38.reg_save_area = ap->reg_save_area;
    local_38.gp_offset = ap->gp_offset;
    local_38.fp_offset = ap->fp_offset;
    local_38.overflow_arg_area = ap->overflow_arg_area;
    iVar1 = _al_bvcformata(us,count,fmt,&local_38);
    count = -iVar1;
  } while (iVar1 < -1);
  return iVar1 != -1;
}

Assistant:

bool al_ustr_vappendf(ALLEGRO_USTR *us, const char *fmt, va_list ap)
{
   va_list arglist;
   int sz;
   int rc;

#ifdef DEBUGMODE
   /* Exercise resizing logic more often. */
   sz = 1;
#else
   sz = 128;
#endif

   for (;;) {
      /* Make a copy of the argument list as vsnprintf() may clobber it. */
      va_copy(arglist, ap);
      rc = _al_bvcformata(us, sz, fmt, arglist);
      va_end(arglist);

      if (rc >= 0) {
         return true;
      }

      if (rc == _AL_BSTR_ERR) {
         /* A real error? */
         return false;
      }

      /* Increase size */
      sz = -rc;
   }
}